

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O0

vector<libtorrent::dht::dht_status,_std::allocator<libtorrent::dht::dht_status>_> * __thiscall
libtorrent::dht::dht_tracker::dht_status
          (vector<libtorrent::dht::dht_status,_std::allocator<libtorrent::dht::dht_status>_>
           *__return_storage_ptr__,dht_tracker *this)

{
  bool bVar1;
  dht_status local_a0;
  reference local_40;
  pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node> *n;
  const_iterator __end2;
  const_iterator __begin2;
  tracker_nodes_t *__range2;
  dht_tracker *this_local;
  vector<libtorrent::dht::dht_status,_std::allocator<libtorrent::dht::dht_status>_> *ret;
  
  ::std::vector<libtorrent::dht::dht_status,_std::allocator<libtorrent::dht::dht_status>_>::vector
            (__return_storage_ptr__);
  __end2 = ::std::
           map<libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node,_std::less<libtorrent::aux::listen_socket_handle>,_std::allocator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>_>
           ::begin(&this->m_nodes);
  n = (pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>
       *)::std::
         map<libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node,_std::less<libtorrent::aux::listen_socket_handle>,_std::allocator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>_>
         ::end(&this->m_nodes);
  while (bVar1 = ::std::operator!=(&__end2,(_Self *)&n), bVar1) {
    local_40 = ::std::
               _Rb_tree_const_iterator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>
               ::operator*(&__end2);
    dht::node::status(&local_a0,&(local_40->second).dht);
    ::std::vector<libtorrent::dht::dht_status,_std::allocator<libtorrent::dht::dht_status>_>::
    emplace_back<libtorrent::dht::dht_status>(__return_storage_ptr__,&local_a0);
    dht::dht_status::~dht_status(&local_a0);
    ::std::
    _Rb_tree_const_iterator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<lt::dht::dht_status> dht_tracker::dht_status() const
	{
		std::vector<lt::dht::dht_status> ret;
		for (auto const& n : m_nodes)
			ret.emplace_back(n.second.dht.status());
		return ret;
	}